

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_query.cpp
# Opt level: O1

void __thiscall
QuerySequenceTest_invalids_2len_trailing_Test<char8_t>::
~QuerySequenceTest_invalids_2len_trailing_Test
          (QuerySequenceTest_invalids_2len_trailing_Test<char8_t> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST(QuerySequenceTest, invalids_2len_trailing) {
	std::basic_string<TypeParam> query_string, long_query_string;
	for (size_t unit = 0; unit <= 0xFFFF; ++unit) {
		TypeParam first = static_cast<TypeParam>(unit >> 8); // order of these two doesn't matter
		TypeParam second = static_cast<TypeParam>(unit & 0xFF);
		if (jessilib::as_base(first, 16) >= 0
			&& jessilib::as_base(second, 16) >= 0) {
			continue;
		}
		TypeParam encoded[4] { '%', static_cast<TypeParam>(first), static_cast<TypeParam>(second), '%' };
		TypeParam* encoded_end = encoded + sizeof(encoded);
		query_string.insert(query_string.end(), encoded, encoded_end);

		long_query_string += query_string;
		jessilib::deserialize_http_query(query_string);
		EXPECT_TRUE(query_string.empty())
						<< "in unit: " << unit << std::endl;
	}

	jessilib::deserialize_http_query(long_query_string);
	EXPECT_TRUE(long_query_string.empty());
}